

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O3

void * min_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *ptVar1;
  t_float tVar2;
  
  if (argc < 2) {
    if (argc == 0) {
      ptVar1 = (t_object *)pd_new(min_class);
      inlet_new(ptVar1,(t_pd *)ptVar1,&s_signal,&s_signal);
      outlet_new(ptVar1,&s_signal);
      *(undefined4 *)&ptVar1[1].te_g.g_pd = 0;
      return ptVar1;
    }
  }
  else {
    post("min~: extra arguments ignored");
  }
  ptVar1 = (t_object *)pd_new(scalarmin_class);
  floatinlet_new(ptVar1,(t_float *)(ptVar1 + 1));
  tVar2 = atom_getfloatarg(0,argc,argv);
  *(t_float *)&ptVar1[1].te_g.g_pd = tVar2;
  outlet_new(ptVar1,&s_signal);
  *(undefined4 *)((long)&ptVar1[1].te_g.g_pd + 4) = 0;
  return ptVar1;
}

Assistant:

static void *min_new(t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1) post("min~: extra arguments ignored");
    if (argc)
    {
        t_scalarmin *x = (t_scalarmin *)pd_new(scalarmin_class);
        floatinlet_new(&x->x_obj, &x->x_g);
        x->x_g = atom_getfloatarg(0, argc, argv);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
    else
    {
        t_min *x = (t_min *)pd_new(min_class);
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
}